

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O2

void nukedopll_reset_chip(void *chipptr)

{
  undefined8 uVar1;
  long lVar2;
  uint uVar3;
  
  uVar1 = *chipptr;
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 0xe; lVar2 = lVar2 + 1) {
    uVar3 = uVar3 | *(int *)((long)chipptr + lVar2 * 4 + 0x198) << ((byte)lVar2 & 0x1f);
  }
  NOPLL_Reset((opll_t *)chipptr,*(uint32_t *)((long)chipptr + 0x10),
              *(uint32_t *)((long)chipptr + 0xc),*(uint32_t *)((long)chipptr + 8));
  *(undefined8 *)chipptr = uVar1;
  for (lVar2 = 0; lVar2 != 0xe; lVar2 = lVar2 + 1) {
    *(uint *)((long)chipptr + lVar2 * 4 + 0x198) = (uint)((uVar3 >> ((uint)lVar2 & 0x1f) & 1) != 0);
  }
  return;
}

Assistant:

static void nukedopll_reset_chip(void *chipptr)
{
	opll_t *chip = (opll_t *)chipptr;
	UINT8 chn;
	DEV_DATA devData;
	UINT32 mute;
	
	devData = chip->_devData;
	mute = 0;
	for (chn = 0; chn < 14; chn ++)
		mute |= (chip->mute[chn] << chn);
	
	NOPLL_Reset(chip, chip->chip_type, chip->smplRate, chip->clock);
	
	chip->_devData = devData;
	for (chn = 0; chn < 14; chn ++)
		chip->mute[chn] = (mute >> chn) & 0x01;
	
	return;
}